

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O0

int32_t __thiscall icu_63::IslamicCalendar::yearStart(IslamicCalendar *this,int32_t year)

{
  int32_t iVar1;
  int32_t yrStartLinearEstimate;
  int32_t year_local;
  IslamicCalendar *this_local;
  
  if (((*(int *)&(this->super_Calendar).field_0x264 == 1) ||
      (*(int *)&(this->super_Calendar).field_0x264 == 3)) ||
     ((*(int *)&(this->super_Calendar).field_0x264 == 2 && ((year < 0x514 || (0x640 < year)))))) {
    iVar1 = ClockMath::floorDivide(year * 0xb + 3,0x1e);
    this_local._4_4_ = (year + -1) * 0x162 + iVar1;
  }
  else if (*(int *)&(this->super_Calendar).field_0x264 == 0) {
    this_local._4_4_ = trueMonthStart(this,(year + -1) * 0xc);
  }
  else {
    this_local._4_4_ =
         (int)((double)(year + -0x514) * 354.3672 + 460322.05 + 0.5) +
         (int)(char)umAlQuraYrStartEstimateFix[year + -0x514];
  }
  return this_local._4_4_;
}

Assistant:

int32_t IslamicCalendar::yearStart(int32_t year) const{
    if (cType == CIVIL || cType == TBLA ||
        (cType == UMALQURA && (year < UMALQURA_YEAR_START || year > UMALQURA_YEAR_END))) 
    {
        return (year-1)*354 + ClockMath::floorDivide((3+11*year),30);
    } else if(cType==ASTRONOMICAL){
        return trueMonthStart(12*(year-1));
    } else {
        year -= UMALQURA_YEAR_START;
        // rounded least-squares fit of the dates previously calculated from UMALQURA_MONTHLENGTH iteration
        int32_t yrStartLinearEstimate = (int32_t)((354.36720 * (double)year) + 460322.05 + 0.5);
        // need a slight correction to some
        return yrStartLinearEstimate + umAlQuraYrStartEstimateFix[year];
    }
}